

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__parse_uncompressed_block(stbi__zbuf *a)

{
  stbi_uc sVar1;
  uint uVar2;
  int iVar3;
  stbi__zbuf *in_RDI;
  int k;
  int nlen;
  int len;
  stbi_uc header [4];
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_RDI->num_bits & 7U) != 0) {
    stbi__zreceive((stbi__zbuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc);
  }
  iVar3 = 0;
  while (0 < in_RDI->num_bits) {
    (&stack0xffffffffffffffec)[iVar3] = (char)in_RDI->code_buffer;
    in_RDI->code_buffer = in_RDI->code_buffer >> 8;
    in_RDI->num_bits = in_RDI->num_bits + -8;
    iVar3 = iVar3 + 1;
  }
  for (; iVar3 < 4; iVar3 = iVar3 + 1) {
    sVar1 = stbi__zget8(in_RDI);
    (&stack0xffffffffffffffec)[iVar3] = sVar1;
  }
  uVar2 = (in_stack_ffffffffffffffec >> 8 & 0xff) * 0x100 + (in_stack_ffffffffffffffec & 0xff);
  if ((in_stack_ffffffffffffffec >> 0x18) * 0x100 + (in_stack_ffffffffffffffec >> 0x10 & 0xff) ==
      (uVar2 ^ 0xffff)) {
    if (in_RDI->zbuffer_end < in_RDI->zbuffer + (int)uVar2) {
      iVar3 = stbi__err("read past buffer");
    }
    else if ((in_RDI->zout_end < in_RDI->zout + (int)uVar2) &&
            (iVar3 = stbi__zexpand((stbi__zbuf *)
                                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                   (char *)in_RDI,in_stack_ffffffffffffffec), iVar3 == 0)) {
      iVar3 = 0;
    }
    else {
      memcpy(in_RDI->zout,in_RDI->zbuffer,(long)(int)uVar2);
      in_RDI->zbuffer = in_RDI->zbuffer + (int)uVar2;
      in_RDI->zout = in_RDI->zout + (int)uVar2;
      iVar3 = 1;
    }
  }
  else {
    iVar3 = stbi__err("zlib corrupt");
  }
  return iVar3;
}

Assistant:

static int stbi__parse_uncompressed_block(stbi__zbuf *a)
{
   stbi_uc header[4];
   int len,nlen,k;
   if (a->num_bits & 7)
      stbi__zreceive(a, a->num_bits & 7); // discard
   // drain the bit-packed data into header
   k = 0;
   while (a->num_bits > 0) {
      header[k++] = (stbi_uc) (a->code_buffer & 255); // suppress MSVC run-time check
      a->code_buffer >>= 8;
      a->num_bits -= 8;
   }
   STBI_ASSERT(a->num_bits == 0);
   // now fill header the normal way
   while (k < 4)
      header[k++] = stbi__zget8(a);
   len  = header[1] * 256 + header[0];
   nlen = header[3] * 256 + header[2];
   if (nlen != (len ^ 0xffff)) return stbi__err("zlib corrupt","Corrupt PNG");
   if (a->zbuffer + len > a->zbuffer_end) return stbi__err("read past buffer","Corrupt PNG");
   if (a->zout + len > a->zout_end)
      if (!stbi__zexpand(a, a->zout, len)) return 0;
   memcpy(a->zout, a->zbuffer, len);
   a->zbuffer += len;
   a->zout += len;
   return 1;
}